

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,double,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  double *pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  double dVar5;
  
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = (double *)result->data;
    dVar5 = FinalizeEntropy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
                      (*(duckdb **)(*(long *)states->data + 0x18),
                       *(ModeState<duckdb::string_t,_duckdb::ModeString> **)
                        (*(long *)states->data + 0x38));
    *pdVar1 = dVar5;
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    if (count != 0) {
      pdVar2 = states->data;
      pdVar3 = result->data;
      iVar4 = 0;
      do {
        dVar5 = FinalizeEntropy<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
                          (*(duckdb **)(*(long *)(pdVar2 + iVar4 * 8) + 0x18),
                           *(ModeState<duckdb::string_t,_duckdb::ModeString> **)
                            (*(long *)(pdVar2 + iVar4 * 8) + 0x38));
        *(double *)(pdVar3 + iVar4 * 8 + offset * 8) = dVar5;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}